

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O0

void deleteForeign(string *val)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RDI;
  undefined8 in_stack_ffffffffffffff48;
  undefined1 pv_;
  assertion_result *this;
  lazy_ostream *prev;
  basic_cstring<const_char> local_90;
  const_string *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  const_string *in_stack_ffffffffffffff98;
  unit_test_log_t *in_stack_ffffffffffffffa0;
  assertion_result local_40;
  lazy_ostream local_18;
  string *local_8;
  
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"Deleting foreign string containing ");
  poVar2 = std::operator<<(poVar2,local_8);
  std::operator<<(poVar2,'\n');
  do {
    pv_ = (undefined1)((ulong)in_stack_ffffffffffffff48 >> 0x38);
    prev = &local_18;
    this = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)prev,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88);
    boost::test_tools::assertion_result::assertion_result(this,(bool)pv_);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&stack0xffffffffffffff80,"safeToDelete",0xc);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    in_stack_ffffffffffffff48 = 0;
    boost::test_tools::tt_detail::report_assertion
              (&local_40,(lazy_ostream *)&stack0xffffffffffffffa0,&local_90,0x40c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)0x23d198);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x23d1a2);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  return;
}

Assistant:

void deleteForeign(const std::string &val) 
{
    std::cout << "Deleting foreign string containing " << val << '\n';
    BOOST_CHECK(safeToDelete);
}